

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O1

void __thiscall tst_InsertProxyModel::testDataForCorner(tst_InsertProxyModel *this)

{
  char *pcVar1;
  long this_00;
  char *pcVar2;
  Data *pDVar3;
  Data *pDVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  QAbstractItemModel *pQVar9;
  QAbstractItemModelTester *this_01;
  char *pcVar10;
  char *pcVar11;
  QList<int> roles;
  InsertProxyModel proxyModel;
  QSignalSpy cornerDataChangeSpy;
  QSignalSpy cornerChangeSpy;
  anon_union_24_3_e3d07ef4_for_data local_1d8;
  undefined8 local_1c0;
  QList<int> local_1b0;
  QArrayDataPointer<QVariant> local_198;
  undefined1 local_180 [24];
  QArrayDataPointer<QVariant> local_168;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  QSignalSpy local_138;
  QSignalSpy local_b8;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  pQVar9 = createListModel(&this->super_QObject);
  InsertProxyModel::InsertProxyModel((InsertProxyModel *)local_180,(QObject *)0x0);
  this_01 = (QAbstractItemModelTester *)operator_new(0x10);
  QAbstractItemModelTester::QAbstractItemModelTester
            (this_01,(QAbstractItemModel *)local_180,QtTest,(QObject *)pQVar9);
  *(undefined ***)this_01 = &PTR_metaObject_0012c978;
  QSignalSpy::QSignalSpy(&local_b8,(QObject *)local_180,"2dataForCornerChanged(QVector<int>)");
  QSignalSpy::QSignalSpy
            (&local_138,(QObject *)local_180,"2dataChanged(QModelIndex, QModelIndex, QVector<int>)")
  ;
  cVar5 = QTest::qVerify(local_b8.sig.d.size != 0,"cornerChangeSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,0x201);
  if (cVar5 == '\0') goto LAB_00113421;
  cVar5 = QTest::qVerify(local_138.sig.d.size != 0,"cornerDataChangeSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,0x202);
  if (cVar5 == '\0') goto LAB_00113421;
  local_1d8._0_4_ = 3;
  InsertProxyModel::setInsertDirection(local_180);
  InsertProxyModel::setSourceModel((QAbstractItemModel *)local_180);
  QVariant::QVariant((QVariant *)&local_1d8,0x1639);
  iVar8 = (int)&local_1d8;
  InsertProxyModel::setDataForCorner((QVariant *)local_180,iVar8);
  QVariant::~QVariant((QVariant *)&local_1d8);
  local_198.d = (Data *)0xffffffffffffffff;
  local_198.ptr = (QVariant *)0x0;
  local_198.size = 0;
  uVar6 = (**(code **)(*(long *)pQVar9 + 0x78))(pQVar9);
  local_168.d = (Data *)0xffffffffffffffff;
  local_168.ptr = (QVariant *)0x0;
  local_168.size = 0;
  (**(code **)(*(long *)pQVar9 + 0x80))(pQVar9);
  local_150 = 0xffffffffffffffff;
  local_148 = 0;
  uStack_140 = 0;
  InsertProxyModel::index((int)&local_1b0,(int)local_180,(QModelIndex *)(ulong)uVar6);
  if ((long *)local_1b0.d.size == (long *)0x0) {
    local_1d8.shared = (PrivateShared *)0x0;
    local_1d8._8_8_ = 0;
    local_1d8._16_8_ = 0;
    local_1c0 = 2;
  }
  else {
    (**(code **)(*(long *)local_1b0.d.size + 0x90))(&local_1d8,local_1b0.d.size,&local_1b0,0);
  }
  iVar7 = QVariant::toInt((bool *)local_1d8.data);
  cVar5 = QTest::qCompare(iVar7,0x1639,
                          "proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data().toInt()"
                          ,"5689",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                          ,0x206);
  QVariant::~QVariant((QVariant *)&local_1d8);
  if (cVar5 == '\0') goto LAB_00113421;
  InsertProxyModel::dataForCorner(iVar8);
  iVar7 = QVariant::toInt((bool *)local_1d8.data);
  cVar5 = QTest::qCompare(iVar7,0x1639,"proxyModel.dataForCorner().toInt()","5689",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                          ,0x207);
  QVariant::~QVariant((QVariant *)&local_1d8);
  if (cVar5 == '\0') goto LAB_00113421;
  cVar5 = QTest::qCompare(local_b8.super_QList<QList<QVariant>_>.d.size,1,"cornerChangeSpy.count()",
                          "1",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                          ,0x208);
  if (cVar5 == '\0') goto LAB_00113421;
  cVar5 = QTest::qCompare(local_138.super_QList<QList<QVariant>_>.d.size,1,
                          "cornerDataChangeSpy.count()","1",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                          ,0x209);
  if (cVar5 == '\0') goto LAB_00113421;
  this_00 = (long)&local_b8 + 0x10;
  QList<QList<QVariant>_>::value((QList<QVariant> *)&local_198,(QList<QList<QVariant>_> *)this_00,0)
  ;
  QList<QVariant>::value((QVariant *)&local_1d8,(QList<QVariant> *)&local_198,0);
  QVariant::value<QList<int>>(&local_1b0,(QVariant *)&local_1d8);
  QVariant::~QVariant((QVariant *)&local_1d8);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_198);
  QList<QList<QVariant>_>::clear((QList<QList<QVariant>_> *)this_00);
  QList<QList<QVariant>_>::clear((QList<QList<QVariant>_> *)((long)&local_138 + 0x10U));
  pcVar10 = "2";
  cVar5 = QTest::qCompare(local_1b0.d.size,2,"roles.size()","2",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                          ,0x20d);
  if (cVar5 != '\0') {
    if (local_1b0.d.size < 1) {
LAB_00112edb:
      pcVar10 = (char *)0xffffffffffffffff;
    }
    else {
      pcVar11 = (char *)0xfffffffffffffffc;
      do {
        pcVar1 = pcVar11 + local_1b0.d.size * -4;
        if (pcVar1 == (char *)0xfffffffffffffffc) goto LAB_00112ed5;
        pcVar10 = pcVar11 + 4;
        pcVar2 = pcVar11 + 4;
        pcVar11 = pcVar10;
      } while (*(int *)(pcVar2 + (long)&((Private *)local_1b0.d.ptr)->data) != 2);
      pcVar10 = (char *)((long)pcVar10 >> 2);
LAB_00112ed5:
      if (pcVar1 == (char *)0xfffffffffffffffc) goto LAB_00112edb;
    }
    pcVar11 = 
    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
    ;
    cVar5 = QTest::qVerify(pcVar10 != (char *)0xffffffffffffffff,"roles.contains(Qt::EditRole)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                           ,0x20e);
    if (cVar5 != '\0') {
      if (local_1b0.d.size < 1) {
LAB_00112f53:
        pcVar11 = (char *)0xffffffffffffffff;
      }
      else {
        pcVar10 = (char *)0xfffffffffffffffc;
        do {
          pcVar1 = pcVar10 + local_1b0.d.size * -4;
          if (pcVar1 == (char *)0xfffffffffffffffc) goto LAB_00112f4d;
          pcVar11 = pcVar10 + 4;
          pcVar2 = pcVar10 + 4;
          pcVar10 = pcVar11;
        } while (*(int *)(pcVar2 + (long)&((Private *)local_1b0.d.ptr)->data) != 0);
        pcVar11 = (char *)((long)pcVar11 >> 2);
LAB_00112f4d:
        if (pcVar1 == (char *)0xfffffffffffffffc) goto LAB_00112f53;
      }
      cVar5 = QTest::qVerify(pcVar11 != (char *)0xffffffffffffffff,"roles.contains(Qt::DisplayRole)"
                             ,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                             ,0x20f);
      if (cVar5 != '\0') {
        InsertProxyModel::setMergeDisplayEdit(SUB81(local_180,0));
        QVariant::QVariant((QVariant *)&local_1d8,0x2225);
        InsertProxyModel::setDataForCorner((QVariant *)local_180,iVar8);
        QVariant::~QVariant((QVariant *)&local_1d8);
        local_168.d = (Data *)0xffffffffffffffff;
        local_168.ptr = (QVariant *)0x0;
        local_168.size = 0;
        uVar6 = (**(code **)(*(long *)pQVar9 + 0x78))(pQVar9);
        local_150 = 0xffffffffffffffff;
        local_148 = 0;
        uStack_140 = 0;
        (**(code **)(*(long *)pQVar9 + 0x80))(pQVar9);
        local_38 = 0xffffffffffffffff;
        local_30 = 0;
        uStack_28 = 0;
        InsertProxyModel::index((int)&local_198,(int)local_180,(QModelIndex *)(ulong)uVar6);
        if ((long *)local_198.size == (long *)0x0) {
          local_1d8.shared = (PrivateShared *)0x0;
          local_1d8._8_8_ = 0;
          local_1d8._16_8_ = 0;
          local_1c0 = 2;
        }
        else {
          (**(code **)(*(long *)local_198.size + 0x90))(&local_1d8,local_198.size,&local_198,0);
        }
        iVar7 = QVariant::toInt((bool *)local_1d8.data);
        cVar5 = QTest::qCompare(iVar7,0x1639,
                                "proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data().toInt()"
                                ,"5689",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                ,0x212);
        QVariant::~QVariant((QVariant *)&local_1d8);
        if (cVar5 != '\0') {
          InsertProxyModel::dataForCorner(iVar8);
          iVar7 = QVariant::toInt((bool *)local_1d8.data);
          cVar5 = QTest::qCompare(iVar7,0x1639,"proxyModel.dataForCorner().toInt()","5689",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                  ,0x213);
          QVariant::~QVariant((QVariant *)&local_1d8);
          if (cVar5 != '\0') {
            local_168.d = (Data *)0xffffffffffffffff;
            local_168.ptr = (QVariant *)0x0;
            local_168.size = 0;
            uVar6 = (**(code **)(*(long *)pQVar9 + 0x78))(pQVar9);
            local_150 = 0xffffffffffffffff;
            local_148 = 0;
            uStack_140 = 0;
            (**(code **)(*(long *)pQVar9 + 0x80))(pQVar9);
            local_38 = 0xffffffffffffffff;
            local_30 = 0;
            uStack_28 = 0;
            InsertProxyModel::index((int)&local_198,(int)local_180,(QModelIndex *)(ulong)uVar6);
            if ((long *)local_198.size == (long *)0x0) {
              local_1d8.shared = (PrivateShared *)0x0;
              local_1d8._8_8_ = 0;
              local_1d8._16_8_ = 0;
              local_1c0 = 2;
            }
            else {
              (**(code **)(*(long *)local_198.size + 0x90))(&local_1d8,local_198.size,&local_198,2);
            }
            iVar7 = QVariant::toInt((bool *)local_1d8.data);
            cVar5 = QTest::qCompare(iVar7,0x2225,
                                    "proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data(Qt::EditRole).toInt()"
                                    ,"8741",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                    ,0x214);
            QVariant::~QVariant((QVariant *)&local_1d8);
            if (cVar5 != '\0') {
              InsertProxyModel::dataForCorner(iVar8);
              iVar8 = QVariant::toInt((bool *)local_1d8.data);
              cVar5 = QTest::qCompare(iVar8,0x2225,"proxyModel.dataForCorner(Qt::EditRole).toInt()",
                                      "8741",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                      ,0x215);
              QVariant::~QVariant((QVariant *)&local_1d8);
              if (cVar5 != '\0') {
                cVar5 = QTest::qCompare(local_b8.super_QList<QList<QVariant>_>.d.size,1,
                                        "cornerChangeSpy.count()","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                        ,0x216);
                if (cVar5 != '\0') {
                  cVar5 = QTest::qCompare(local_138.super_QList<QList<QVariant>_>.d.size,1,
                                          "cornerDataChangeSpy.count()","1",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                          ,0x217);
                  if (cVar5 != '\0') {
                    QList<QList<QVariant>_>::value
                              ((QList<QVariant> *)&local_168,(QList<QList<QVariant>_> *)this_00,0);
                    QList<QVariant>::value((QVariant *)&local_1d8,(QList<QVariant> *)&local_168,0);
                    QVariant::value<QList<int>>((QList<int> *)&local_198,(QVariant *)&local_1d8);
                    local_1b0.d.size = local_198.size;
                    local_1b0.d.ptr = (int *)local_198.ptr;
                    pDVar4 = local_198.d;
                    pDVar3 = local_1b0.d.d;
                    local_198.d = (Data *)0x0;
                    local_198.ptr = (QVariant *)0x0;
                    local_198.size = 0;
                    local_1b0.d.d = (Data *)pDVar4;
                    if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                           -1;
                      UNLOCK();
                      if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                          0) {
                        QArrayData::deallocate(&pDVar3->super_QArrayData,4,8);
                      }
                    }
                    if (&(local_198.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_198.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_198.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_198.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_198.d)->super_QArrayData,4,8);
                      }
                    }
                    QVariant::~QVariant((QVariant *)&local_1d8);
                    QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_168);
                    QList<QList<QVariant>_>::clear((QList<QList<QVariant>_> *)this_00);
                    QList<QList<QVariant>_>::clear
                              ((QList<QList<QVariant>_> *)((long)&local_138 + 0x10U));
                    pcVar10 = "1";
                    cVar5 = QTest::qCompare(local_1b0.d.size,1,"roles.size()","1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                            ,0x21b);
                    if (cVar5 != '\0') {
                      if (local_1b0.d.size < 1) {
LAB_001133c1:
                        pcVar10 = (char *)0xffffffffffffffff;
                      }
                      else {
                        pcVar11 = (char *)0xfffffffffffffffc;
                        do {
                          pcVar1 = pcVar11 + local_1b0.d.size * -4;
                          if (pcVar1 == (char *)0xfffffffffffffffc) goto LAB_001133bb;
                          pcVar10 = pcVar11 + 4;
                          pcVar2 = pcVar11 + 4;
                          pcVar11 = pcVar10;
                        } while (*(int *)(pcVar2 + (long)&((Private *)local_1b0.d.ptr)->data) != 2);
                        pcVar10 = (char *)((long)pcVar10 >> 2);
LAB_001133bb:
                        if (pcVar1 == (char *)0xfffffffffffffffc) goto LAB_001133c1;
                      }
                      cVar5 = QTest::qVerify(pcVar10 != (char *)0xffffffffffffffff,
                                             "roles.contains(Qt::EditRole)","",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                             ,0x21c);
                      if (cVar5 != '\0') {
                        QObject::deleteLater();
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (&(local_1b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_1b0.d.d)->super_QArrayData,4,8);
    }
  }
LAB_00113421:
  local_138._0_8_ = &PTR_metaObject_0012c890;
  QObject::~QObject((QObject *)((long)&local_138 + 0x58));
  if (&(local_138.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_138.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_138 + 0x10));
  QObject::~QObject(&local_138.super_QObject);
  local_b8._0_8_ = &PTR_metaObject_0012c890;
  QObject::~QObject((QObject *)((long)&local_b8 + 0x58));
  if (&(local_b8.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_b8.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_b8 + 0x10));
  QObject::~QObject(&local_b8.super_QObject);
  InsertProxyModel::~InsertProxyModel((InsertProxyModel *)local_180);
  return;
}

Assistant:

void tst_InsertProxyModel::testDataForCorner()
{
    QAbstractItemModel *const baseModel = createListModel(this);
    InsertProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    QSignalSpy cornerChangeSpy(&proxyModel, SIGNAL(dataForCornerChanged(QVector<int>)));
    QSignalSpy cornerDataChangeSpy(&proxyModel, SIGNAL(dataChanged(QModelIndex, QModelIndex, QVector<int>)));
    QVERIFY(cornerChangeSpy.isValid());
    QVERIFY(cornerDataChangeSpy.isValid());
    proxyModel.setInsertDirection(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow);
    proxyModel.setSourceModel(baseModel);
    proxyModel.setDataForCorner(5689);
    QCOMPARE(proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data().toInt(), 5689);
    QCOMPARE(proxyModel.dataForCorner().toInt(), 5689);
    QCOMPARE(cornerChangeSpy.count(), 1);
    QCOMPARE(cornerDataChangeSpy.count(), 1);
    auto roles = cornerChangeSpy.value(0).value(0).value<QVector<int>>();
    cornerChangeSpy.clear();
    cornerDataChangeSpy.clear();
    QCOMPARE(roles.size(), 2);
    QVERIFY(roles.contains(Qt::EditRole));
    QVERIFY(roles.contains(Qt::DisplayRole));
    proxyModel.setMergeDisplayEdit(false);
    proxyModel.setDataForCorner(8741);
    QCOMPARE(proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data().toInt(), 5689);
    QCOMPARE(proxyModel.dataForCorner().toInt(), 5689);
    QCOMPARE(proxyModel.index(baseModel->rowCount(), baseModel->columnCount()).data(Qt::EditRole).toInt(), 8741);
    QCOMPARE(proxyModel.dataForCorner(Qt::EditRole).toInt(), 8741);
    QCOMPARE(cornerChangeSpy.count(), 1);
    QCOMPARE(cornerDataChangeSpy.count(), 1);
    roles = cornerChangeSpy.value(0).value(0).value<QVector<int>>();
    cornerChangeSpy.clear();
    cornerDataChangeSpy.clear();
    QCOMPARE(roles.size(), 1);
    QVERIFY(roles.contains(Qt::EditRole));
    baseModel->deleteLater();
}